

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool dxil_spv::id_is_generated_by_block(CFGNode *block,Id id)

{
  bool bVar1;
  Vector<Operation_*> *this;
  reference ppOVar2;
  reference pPVar3;
  PHI *phi;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  Vector<PHI> *__range1_1;
  Operation *op;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<Operation_*> *__range1;
  Id id_local;
  CFGNode *block_local;
  
  this = &(block->ir).operations;
  __end1 = std::
           vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
           begin(this);
  op = (Operation *)
       std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
       end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::Operation_*const_*,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
                                *)&op);
    if (!bVar1) {
      __end1_1 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::begin
                           (&(block->ir).phi);
      phi = (PHI *)std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::end
                             (&(block->ir).phi);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<const_dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
                            *)&phi);
        if (!bVar1) {
          return false;
        }
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
                 ::operator*(&__end1_1);
        if (pPVar3->id == id) break;
        __gnu_cxx::
        __normal_iterator<const_dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
        ::operator++(&__end1_1);
      }
      return true;
    }
    ppOVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::Operation_*const_*,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
              ::operator*(&__end1);
    if ((*ppOVar2)->id == id) break;
    __gnu_cxx::
    __normal_iterator<dxil_spv::Operation_*const_*,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

static bool id_is_generated_by_block(const CFGNode *block, spv::Id id)
{
	for (const auto *op : block->ir.operations)
		if (op->id == id)
			return true;

	for (const auto &phi : block->ir.phi)
		if (phi.id == id)
			return true;

	return false;
}